

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

bool __thiscall
wasm::PrintSExpression::maybePrintUnreachableReplacement
          (PrintSExpression *this,Expression *curr,Type type)

{
  Index IVar1;
  ostream *poVar2;
  char *pcVar3;
  Expression **ppEVar4;
  Expression *pEVar5;
  Iterator IVar6;
  undefined1 local_a8 [8];
  Unreachable unreachable;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_80;
  undefined1 local_68 [8];
  Drop drop;
  Iterator local_40;
  
  if (type.id == 1) {
    std::operator<<(this->o,"(block");
    if (this->minify == false) {
      poVar2 = std::operator<<(this->o," ;; (replaces unreachable ");
      pcVar3 = getExpressionName(curr);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2," we can\'t emit)");
    }
    incIndent(this);
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_a8,curr);
    local_40.index = 0;
    local_40.parent = (Self *)local_a8;
    IVar6 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)local_a8);
    drop.value = (Expression *)IVar6.parent;
    IVar1 = 0;
    pEVar5 = (Expression *)local_a8;
    while ((IVar1 != IVar6.index || (pEVar5 != drop.value))) {
      ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_40);
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)*ppEVar4;
      local_68[0] = DropId;
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._id = InvalidId;
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._1_7_ = 0;
      printFullLine(this,(Expression *)local_68);
      IVar1 = local_40.index + 1;
      pEVar5 = (Expression *)local_40.parent;
      local_40.index = IVar1;
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_80);
    local_a8[0] = UnreachableId;
    unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._id = BlockId;
    unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._1_7_ = 0;
    printFullLine(this,(Expression *)local_a8);
    decIndent(this);
  }
  return type.id == 1;
}

Assistant:

bool PrintSExpression::maybePrintUnreachableReplacement(Expression* curr,
                                                        Type type) {
  // When we cannot print an instruction because the child from which it's
  // supposed to get a type immediate is unreachable, then we print a
  // semantically-equivalent block that drops each of the children and ends in
  // an unreachable.
  if (type != Type::unreachable) {
    return false;
  }

  // Emit a block with drops of the children.
  o << "(block";
  if (!minify) {
    o << " ;; (replaces unreachable " << getExpressionName(curr)
      << " we can't emit)";
  }
  incIndent();
  for (auto* child : ChildIterator(curr)) {
    Drop drop;
    drop.value = child;
    printFullLine(&drop);
  }
  Unreachable unreachable;
  printFullLine(&unreachable);
  decIndent();
  return true;
}